

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

void * encode_attr_for_xmit(attr_list l,AttrBuffer b,int *length)

{
  int_attr_struct *piVar1;
  
  if ((l->list_of_lists == 0) && (piVar1 = (l->l).list.iattrs, piVar1->other_attr_count == '\0')) {
    b = (AttrBuffer)((long)&l->l + 8);
    *length = (uint)piVar1->int_attr_count * 8 + 4;
  }
  else {
    add_to_tmp_buffer(b,0xc);
    if (words_bigendian == '\0') {
      words_bigendian = '\x01';
    }
    *(undefined4 *)b->tmp_buffer = 0;
    b->tmp_buffer_in_use_size = 4;
    recursive_encode(l,b,Attr_Int4);
    recursive_encode(l,b,Attr_Undefined);
    *length = b->tmp_buffer_in_use_size;
    add_to_tmp_buffer(b,8);
  }
  return b->tmp_buffer;
}

Assistant:

extern void *
encode_attr_for_xmit(attr_list l, AttrBuffer b, int *length)
{
    if (l->list_of_lists == 0) {
	if (l->l.list.iattrs->other_attr_count == 0) {
	    /* fast case, a single list with no non-integer attributes */
	    /* just return a pointer to the data block */
	    *length = sizeof(struct int_attr_struct) + 
		(l->l.list.iattrs->int_attr_count - 1) * sizeof(int_attr);
	    return l->l.list.iattrs;
	}
    }
    add_to_tmp_buffer(b, (unsigned)sizeof(struct int_attr_struct));
    ((int_attr_p) b->tmp_buffer)->byte_order = WORDS_BIGENDIAN;
    ((int_attr_p) b->tmp_buffer)->int_attr_count = 0;
    ((int_attr_p) b->tmp_buffer)->other_attr_count = 0;
    ((int_attr_p) b->tmp_buffer)->junk = 0;
    /* not the simple case */
    b->tmp_buffer_in_use_size = 4;
    /* first the int Attributes */
    recursive_encode(l, b, Attr_Int4);
    /* then the remaining Attributes */
    recursive_encode(l, b, Attr_Undefined);
    *length = b->tmp_buffer_in_use_size;
    add_to_tmp_buffer(b, 8);  /* pad at the end */
    return b->tmp_buffer;
}